

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O2

void __thiscall Potassco::StringBuilder::~StringBuilder(StringBuilder *this)

{
  string *this_00;
  
  if ((this->field_0).sbo_[0x3f] == 'A') {
    this_00 = (this->field_0).str_;
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string((string *)this_00);
    }
    operator_delete(this_00);
    return;
  }
  return;
}

Assistant:

StringBuilder::~StringBuilder() {
	if (tag() == (Str|Own)) {
		delete str_;
	}
}